

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O2

bool __thiscall AllDiffDomain<0>::check(AllDiffDomain<0> *this)

{
  uint uVar1;
  IntView<0> *pIVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar1 = this->sz;
  if (uVar1 == 0) {
    bVar9 = true;
  }
  else {
    uVar8 = 0;
    uVar3 = 0xffffffff;
    if (-1 < (int)uVar1) {
      uVar3 = uVar1;
    }
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar8;
    }
    pvVar4 = operator_new__((long)(int)uVar3);
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      *(undefined1 *)((long)pvVar4 + uVar8) = 0;
    }
    pIVar2 = this->x;
    lVar5 = 0;
    while ((bVar9 = uVar7 * 0x10 == lVar5, !bVar9 &&
           (lVar6 = *(long *)((long)&pIVar2->var + lVar5),
           lVar6 = (long)*(int *)(lVar6 + 0xc + (ulong)*(byte *)(lVar6 + 0x20) * 0x10),
           *(char *)((long)pvVar4 + lVar6) == '\0'))) {
      *(undefined1 *)((long)pvVar4 + lVar6) = 1;
      lVar5 = lVar5 + 0x10;
    }
    operator_delete__(pvVar4);
  }
  return bVar9;
}

Assistant:

bool check() override {
		if (sz == 0) {
			return true;
		}
		bool* taken = new bool[sz];
		//		bool taken[sz];
		for (int i = 0; i < sz; i++) {
			taken[i] = false;
		}
		for (int i = 0; i < sz; i++) {
			if (taken[x[i].getShadowVal()]) {
				delete[] taken;
				return false;
			}
			taken[x[i].getShadowVal()] = true;
		}
		delete[] taken;
		return true;
	}